

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lysp_stmt_refine(lysp_ctx *ctx,lysp_stmt *stmt,lysp_refine **refines)

{
  lysp_ext_instance **exts;
  uint16_t *flags;
  ly_stmt stmt_00;
  long lVar1;
  lyd_node *plVar2;
  bool bVar3;
  int iVar4;
  LY_ERR LVar5;
  undefined8 *puVar6;
  char *pcVar7;
  char *format;
  uint32_t substmt_index;
  lysp_qname **qnames;
  ly_ctx *plVar8;
  char *in_R8;
  lysp_ext_instance **in_R9;
  lysp_refine *plVar9;
  lysp_stmt *stmt_01;
  
  LVar5 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar5 != LY_SUCCESS) {
    return LVar5;
  }
  plVar9 = *refines;
  if (plVar9 == (lysp_refine *)0x0) {
    puVar6 = (undefined8 *)malloc(0x58);
    if (puVar6 == (undefined8 *)0x0) goto LAB_00171338;
    *puVar6 = 1;
  }
  else {
    lVar1 = *(long *)&plVar9[-1].flags;
    *(long *)&plVar9[-1].flags = lVar1 + 1;
    puVar6 = (undefined8 *)realloc(&plVar9[-1].flags,lVar1 * 0x50 + 0x58);
    if (puVar6 == (undefined8 *)0x0) {
      *(long *)&(*refines)[-1].flags = *(long *)&(*refines)[-1].flags + -1;
LAB_00171338:
      if (ctx == (lysp_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      in_R8 = "lysp_stmt_refine";
      bVar3 = false;
      LVar5 = LY_EMEM;
      ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
      goto LAB_0017137c;
    }
  }
  *refines = (lysp_refine *)(puVar6 + 1);
  bVar3 = true;
  LVar5 = LY_SUCCESS;
LAB_0017137c:
  if (bVar3) {
    plVar9 = *refines;
    lVar1 = *(long *)&plVar9[-1].flags;
    plVar9[lVar1 + -1].exts = (lysp_ext_instance *)0x0;
    *(undefined8 *)&plVar9[lVar1 + -1].flags = 0;
    plVar9[lVar1 + -1].dflts = (lysp_qname *)0x0;
    plVar9[lVar1 + -1].min = 0;
    plVar9[lVar1 + -1].max = 0;
    plVar9[lVar1 + -1].musts = (lysp_restr *)0x0;
    plVar9[lVar1 + -1].presence = (char *)0x0;
    plVar9[lVar1 + -1].ref = (char *)0x0;
    plVar9[lVar1 + -1].iffeatures = (lysp_qname *)0x0;
    plVar9[lVar1 + -1].nodeid = (char *)0x0;
    plVar9[lVar1 + -1].dsc = (char *)0x0;
    if (ctx == (lysp_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar5 = lydict_insert(plVar8,stmt->arg,0,&plVar9[lVar1 + -1].nodeid);
    if ((LVar5 == LY_SUCCESS) &&
       (stmt_01 = stmt->child, LVar5 = LY_SUCCESS, stmt_01 != (lysp_stmt *)0x0)) {
      plVar9 = plVar9 + lVar1;
      exts = &plVar9[-1].exts;
      iVar4 = (int)plVar9;
      flags = &plVar9[-1].flags;
      do {
        stmt_00 = stmt_01->kw;
        if ((int)stmt_00 < 0x180000) {
          if ((int)stmt_00 < 0x80000) {
            if (stmt_00 == LY_STMT_CONFIG) {
              LVar5 = lysp_stmt_config(ctx,stmt_01,flags,exts);
            }
            else {
              qnames = &plVar9[-1].dflts;
              if (stmt_00 != LY_STMT_DEFAULT) goto LAB_00171611;
LAB_0017154f:
              LVar5 = lysp_stmt_qnames(ctx,stmt_01,qnames,(yang_arg)exts,(lysp_ext_instance **)in_R8
                                      );
            }
          }
          else {
            substmt_index = iVar4 - 0x48;
            if (stmt_00 == LY_STMT_DESCRIPTION) goto LAB_001715a5;
            if (stmt_00 != LY_STMT_EXTENSION_INSTANCE) {
              if (stmt_00 == LY_STMT_IF_FEATURE) {
                plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                qnames = &plVar9[-1].iffeatures;
                if (*(byte *)&plVar2[2].schema < 2) {
                  if (ctx == (lysp_ctx *)0x0) {
                    plVar8 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar8 = (ly_ctx *)**(undefined8 **)plVar2;
                  }
                  format = 
                  "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                  ;
                  pcVar7 = "if-feature";
                  goto LAB_0017167e;
                }
                goto LAB_0017154f;
              }
LAB_00171611:
              if (ctx == (lysp_ctx *)0x0) {
                plVar8 = (ly_ctx *)0x0;
              }
              else {
                plVar8 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar7 = lyplg_ext_stmt2str(stmt_00);
              format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_0017167e:
              ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar7,"refine");
              return LY_EVALID;
            }
            in_R8 = (char *)exts;
            LVar5 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_REFINE,0,exts);
          }
        }
        else if ((int)stmt_00 < 0x1d0000) {
          if (stmt_00 == LY_STMT_MANDATORY) {
            LVar5 = lysp_stmt_mandatory(ctx,stmt_01,flags,exts);
          }
          else if (stmt_00 == LY_STMT_MAX_ELEMENTS) {
            in_R8 = (char *)exts;
            LVar5 = lysp_stmt_maxelements(ctx,stmt_01,&plVar9[-1].max,flags,exts);
          }
          else {
            if (stmt_00 != LY_STMT_MIN_ELEMENTS) goto LAB_00171611;
            in_R8 = (char *)exts;
            LVar5 = lysp_stmt_minelements(ctx,stmt_01,&plVar9[-1].min,flags,exts);
          }
        }
        else if (stmt_00 == LY_STMT_MUST) {
          LVar5 = lysp_stmt_restrs(ctx,stmt_01,&plVar9[-1].musts);
        }
        else {
          substmt_index = iVar4 - 0x28;
          if ((stmt_00 != LY_STMT_PRESENCE) &&
             (substmt_index = iVar4 - 0x40, stmt_00 != LY_STMT_REFERENCE)) goto LAB_00171611;
LAB_001715a5:
          in_R8 = (char *)exts;
          LVar5 = lysp_stmt_text_field(ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
        }
        if (LVar5 != LY_SUCCESS) {
          return LVar5;
        }
        stmt_01 = stmt_01->next;
        LVar5 = LY_SUCCESS;
      } while (stmt_01 != (lysp_stmt *)0x0);
    }
  }
  return LVar5;
}

Assistant:

static LY_ERR
lysp_stmt_refine(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_refine **refines)
{
    struct lysp_refine *rf;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *refines, rf, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &rf->nodeid));

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &rf->flags, &rf->exts));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &rf->dflts, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &rf->dsc, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_IF_FEATURE:
            PARSER_CHECK_STMTVER2_RET(ctx, "if-feature", "refine");
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &rf->iffeatures, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_maxelements(ctx, child, &rf->max, &rf->flags, &rf->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_minelements(ctx, child, &rf->min, &rf->flags, &rf->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &rf->musts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(lysp_stmt_mandatory(ctx, child, &rf->flags, &rf->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &rf->ref, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_PRESENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &rf->presence, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_REFINE, 0, &rf->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "refine");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}